

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

void __thiscall
TPZTensor<TFad<6,_double>_>::TPZDecomposed::ComputeJ3(TPZDecomposed *this,TFad<6,_double> *J3)

{
  TFad<6,_double> *this_00;
  TFad<6,_double> *fadexpr;
  TFad<6,_double> *this_01;
  long in_RDI;
  TFad<6,_double> temp;
  TFad<6,_double> s3;
  TFad<6,_double> s2;
  TFad<6,_double> s1;
  TFad<6,_double> sig3;
  TFad<6,_double> sig2;
  TFad<6,_double> sig1;
  TFad<6,_double> *in_stack_fffffffffffffc88;
  TFad<6,_double> *in_stack_fffffffffffffc90;
  TFad<6,_double> *in_stack_fffffffffffffcc0;
  TFad<6,_double> *in_stack_fffffffffffffcc8;
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  *in_stack_fffffffffffffcd0;
  value_type *in_stack_fffffffffffffcd8;
  
  TFad<6,_double>::TFad(in_stack_fffffffffffffc90);
  TFad<6,_double>::TFad(in_stack_fffffffffffffc90);
  TFad<6,_double>::TFad(in_stack_fffffffffffffc90);
  TFad<6,_double>::TFad(in_stack_fffffffffffffc90);
  TFad<6,_double>::TFad(in_stack_fffffffffffffc90);
  TFad<6,_double>::TFad(in_stack_fffffffffffffc90);
  TFad<6,_double>::TFad(in_stack_fffffffffffffc90);
  this_00 = TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 0x38),0);
  TFad<6,_double>::operator=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  fadexpr = TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 0x38),1);
  TFad<6,_double>::operator=(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  this_01 = TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 0x38),2);
  TFad<6,_double>::operator=(this_01,in_stack_fffffffffffffc88);
  ::operator+(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  ::operator+((TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  ::operator*(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  ::operator-(in_stack_fffffffffffffcc8,
              (TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
               *)in_stack_fffffffffffffcc0);
  TFad<6,double>::operator=
            (this_00,(TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>_>_>
                      *)fadexpr);
  TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>_>_>
               *)0x14b2f46);
  TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
               *)0x14b2f53);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
               *)0x14b2f60);
  TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b2f6d);
  ::operator+(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  ::operator+((TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  ::operator*(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  ::operator-(in_stack_fffffffffffffcc8,
              (TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
               *)in_stack_fffffffffffffcc0);
  TFad<6,double>::operator=
            (this_00,(TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>_>_>
                      *)fadexpr);
  TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>_>_>
               *)0x14b301f);
  TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
               *)0x14b302c);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
               *)0x14b3039);
  TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b3046);
  ::operator+(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  ::operator+((TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  ::operator*(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  ::operator-(in_stack_fffffffffffffcc8,
              (TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
               *)in_stack_fffffffffffffcc0);
  TFad<6,double>::operator=
            (this_00,(TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>_>_>
                      *)fadexpr);
  TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>_>_>
               *)0x14b30f8);
  TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
               *)0x14b3105);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
               *)0x14b3112);
  TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b311f);
  ::operator*(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  ::operator*(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  ::operator+((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
               *)in_stack_fffffffffffffcc8,
              (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
               *)in_stack_fffffffffffffcc0);
  ::operator*(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  ::operator*((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  ::operator+((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
               *)in_stack_fffffffffffffcc8,
              (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
               *)in_stack_fffffffffffffcc0);
  ::operator*(in_stack_fffffffffffffcd8,
              (TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
               *)in_stack_fffffffffffffcd0);
  TFad<6,double>::operator=
            (this_00,(TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>_>_>
                      *)fadexpr);
  TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadCst<double>,_TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>_>_>
               *)0x14b3239);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
               *)0x14b3246);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
               *)0x14b3250);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b325a);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
               *)0x14b3267);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
               *)0x14b3271);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b327b);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
               *)0x14b3285);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b328f);
  TFad<6,_double>::operator=(this_01,in_stack_fffffffffffffc88);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b32b3);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b32c0);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b32cd);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b32da);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b32e7);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b32f4);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b3301);
  return;
}

Assistant:

void ComputeJ3(T & J3) {
            T sig1, sig2, sig3, s1, s2, s3, temp;
            sig1 = this->fEigenvalues[0];
            sig2 = this->fEigenvalues[1];
            sig3 = this->fEigenvalues[2];
            s1 = sig1 - (1. / 3.)*(sig1 + sig2 + sig3);
            s2 = sig2 - (1. / 3.)*(sig1 + sig2 + sig3);
            s3 = sig3 - (1. / 3.)*(sig1 + sig2 + sig3);
            temp = (1. / 3.)*(s1 * s1 * s1 + s2 * s2 * s2 + s3 * s3 * s3);
            J3 = temp;
        }